

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

bool __thiscall
tetgenmesh::formcavity
          (tetgenmesh *this,triface *searchtet,arraypool *missingshs,arraypool *crosstets,
          arraypool *topfaces,arraypool *botfaces,arraypool *toppoints,arraypool *botpoints)

{
  uint *puVar1;
  tetrahedron *pppdVar2;
  int iVar3;
  ulong uVar4;
  tetrahedron Q;
  tetrahedron P;
  shellface *pppdVar5;
  char **ppcVar6;
  point pdVar7;
  arraypool *paVar8;
  bool bVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  tetrahedron *pppdVar13;
  unsigned_long uVar14;
  long lVar15;
  int *piVar16;
  point pdVar17;
  shellface p3;
  long lVar18;
  shellface p2;
  int *piVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  tetrahedron ppdVar23;
  shellface p1;
  triface *iedge;
  arraypool *paVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  tetrahedron *pppdVar28;
  tetrahedron *pppdVar29;
  bool bVar30;
  int types [2];
  char *local_b0;
  face *local_a0;
  triface local_98;
  arraypool *local_88;
  long local_80;
  ulong *local_78;
  arraypool *local_70;
  triface local_68;
  int poss [4];
  
  local_98.tet = (tetrahedron *)0x0;
  local_98.ver = 0;
  local_68.tet = (tetrahedron *)0x0;
  local_68.ver = 0;
  if (2 < this->b->verbose) {
    puts("      Form the cavity of a missing region.");
  }
  puVar1 = (uint *)((long)searchtet->tet + (long)this->elemmarkerindex * 4);
  *puVar1 = *puVar1 | 0x40 << (*(byte *)(ver2edge + searchtet->ver) & 0x1f);
  local_b0 = arraypool::getblock(topfaces,(int)topfaces->objects);
  uVar4 = topfaces->objects;
  lVar22 = (long)topfaces->objectbytes * ((long)topfaces->objectsperblock - 1U & uVar4);
  topfaces->objects = uVar4 + 1;
  *(tetrahedron **)(local_b0 + lVar22) = searchtet->tet;
  *(int *)(local_b0 + lVar22 + 8) = searchtet->ver;
  local_88 = topfaces;
  local_70 = crosstets;
  if ((long)uVar4 < 0) {
    topfaces->objects = 0;
  }
  else {
    lVar22 = 0;
    bVar9 = false;
    local_a0 = (face *)0x0;
    do {
      pcVar12 = local_88->toparray[(uint)lVar22 >> ((byte)local_88->log2objectsperblock & 0x1f)];
      lVar27 = (long)local_88->objectbytes *
               (long)(int)(local_88->objectsperblockmark & (uint)lVar22);
      local_78 = (ulong *)(pcVar12 + lVar27);
      pppdVar13 = *(tetrahedron **)(pcVar12 + lVar27);
      lVar18 = (long)*(int *)(pcVar12 + lVar27 + 8);
      ppdVar23 = pppdVar13[orgpivot[lVar18]];
      lVar15 = (long)this->pointmarkindex;
      uVar20 = *(uint *)((long)ppdVar23 + lVar15 * 4 + 4);
      if ((uVar20 & 1) == 0) {
        *(uint *)((long)ppdVar23 + lVar15 * 4 + 4) = uVar20 | 1;
        pcVar11 = arraypool::getblock(botpoints,(int)botpoints->objects);
        uVar4 = botpoints->objects;
        botpoints->objects = uVar4 + 1;
        *(tetrahedron *)
         (pcVar11 + (long)botpoints->objectbytes * ((long)botpoints->objectsperblock - 1U & uVar4))
             = ppdVar23;
        pppdVar13 = (tetrahedron *)*local_78;
        lVar18 = (long)(int)local_78[1];
        lVar15 = (long)this->pointmarkindex;
      }
      ppdVar23 = pppdVar13[destpivot[lVar18]];
      uVar20 = *(uint *)((long)ppdVar23 + lVar15 * 4 + 4);
      if ((uVar20 & 1) == 0) {
        *(uint *)((long)ppdVar23 + lVar15 * 4 + 4) = uVar20 | 1;
        pcVar11 = arraypool::getblock(toppoints,(int)toppoints->objects);
        uVar4 = toppoints->objects;
        toppoints->objects = uVar4 + 1;
        *(tetrahedron *)
         (pcVar11 + (long)toppoints->objectbytes * ((long)toppoints->objectsperblock - 1U & uVar4))
             = ppdVar23;
        pppdVar13 = (tetrahedron *)*local_78;
      }
      paVar24 = local_70;
      piVar19 = (int *)(pcVar12 + lVar27 + 8);
      piVar16 = piVar19;
      pppdVar28 = pppdVar13;
      do {
        iVar3 = *piVar16;
        uVar20 = *(uint *)((long)pppdVar28 + (long)this->elemmarkerindex * 4);
        if ((uVar20 & 1) == 0) {
          *(uint *)((long)pppdVar28 + (long)this->elemmarkerindex * 4) = uVar20 | 1;
          pcVar12 = arraypool::getblock(paVar24,(int)paVar24->objects);
          lVar15 = (long)paVar24->objectbytes *
                   ((long)paVar24->objectsperblock - 1U & paVar24->objects);
          paVar24->objects = paVar24->objects + 1;
          *(tetrahedron **)(pcVar12 + lVar15) = pppdVar28;
          *(int *)(pcVar12 + lVar15 + 8) = iVar3;
          pppdVar13 = (tetrahedron *)*local_78;
        }
        pppdVar29 = pppdVar28 + facepivot1[iVar3];
        pppdVar28 = (tetrahedron *)((ulong)*pppdVar29 & 0xfffffffffffffff0);
        piVar16 = facepivot2[iVar3] + ((uint)*pppdVar29 & 0xf);
        pppdVar29 = pppdVar13;
      } while (pppdVar13 != pppdVar28);
      do {
        iVar3 = *piVar19;
        ppdVar23 = pppdVar29[apexpivot[iVar3]];
        if ((ppdVar23 != (tetrahedron)this->dummypoint) &&
           ((*(byte *)((long)ppdVar23 + (long)this->pointmarkindex * 4 + 4) & 2) == 0)) {
          iVar21 = 0;
          do {
            piVar16 = eprevtbl;
            if (iVar21 == 0) {
              piVar16 = enexttbl;
            }
            uVar20 = piVar16[iVar3];
            pppdVar28 = pppdVar29;
            do {
              local_98.tet = pppdVar28;
              local_98.ver = uVar20;
              if ((*(uint *)((long)pppdVar28 + (long)this->elemmarkerindex * 4) >>
                   (*(byte *)(ver2edge + (int)uVar20) & 0x1f) & 0x40) != 0) goto LAB_00133edd;
              pppdVar2 = pppdVar28 + facepivot1[(int)uVar20];
              pppdVar28 = (tetrahedron *)((ulong)*pppdVar2 & 0xfffffffffffffff0);
              uVar20 = facepivot2[(int)uVar20][(uint)*pppdVar2 & 0xf];
            } while (pppdVar29 != pppdVar28);
            bVar30 = iVar21 == 0;
            iVar21 = iVar21 + 1;
          } while (bVar30);
          local_98.tet = pppdVar28;
          local_98.ver = uVar20;
          if (missingshs->objects < 1) {
            lVar15 = 0;
          }
          else {
            Q = pppdVar29[orgpivot[iVar3]];
            P = pppdVar29[destpivot[iVar3]];
            lVar15 = 0;
            do {
              pcVar12 = missingshs->toparray
                        [(uint)lVar15 >> ((byte)missingshs->log2objectsperblock & 0x1f)];
              lVar27 = (long)missingshs->objectbytes *
                       (long)(int)(missingshs->objectsperblockmark & (uint)lVar15);
              local_a0 = (face *)(pcVar12 + lVar27);
              lVar18 = *(long *)(pcVar12 + lVar27);
              iVar21 = *(int *)(pcVar12 + lVar27 + 8);
              local_80 = lVar15;
              uVar10 = tri_edge_test(this,*(point *)(lVar18 + (long)sorgpivot[iVar21] * 8),
                                     *(point *)(lVar18 + (long)sdestpivot[iVar21] * 8),
                                     *(point *)(lVar18 + (long)sapexpivot[iVar21] * 8),(point)P,
                                     (point)ppdVar23,(point)0x0,1,types,poss);
              local_b0 = (char *)(ulong)uVar10;
              if (uVar10 != 0) {
                lVar15 = local_80;
                if (uVar10 == 2) {
                  uVar20 = enexttbl[iVar3];
                  if ((types[0] & 0xfffffffeU) != 8) {
                    bVar9 = true;
                  }
                  local_b0 = (char *)0x2;
                  pppdVar28 = pppdVar29;
                  local_98.tet = pppdVar29;
                  local_98.ver = uVar20;
                }
                else {
                  bVar9 = true;
                }
                goto LAB_00133ff6;
              }
              pppdVar5 = local_a0->sh;
              iVar21 = local_a0->shver;
              uVar10 = tri_edge_test(this,(point)pppdVar5[sorgpivot[iVar21]],
                                     (point)pppdVar5[sdestpivot[iVar21]],
                                     (point)pppdVar5[sapexpivot[iVar21]],(point)ppdVar23,(point)Q,
                                     (point)0x0,1,types,poss);
              local_b0 = (char *)(ulong)uVar10;
              if (uVar10 != 0) {
                lVar15 = local_80;
                if (uVar10 == 2) {
                  uVar20 = eprevtbl[iVar3];
                  if ((types[0] & 0xfffffffeU) != 8) {
                    bVar9 = true;
                  }
                  local_b0 = (char *)0x2;
                  pppdVar28 = pppdVar29;
                  local_98.tet = pppdVar29;
                  local_98.ver = uVar20;
                }
                else {
                  bVar9 = true;
                }
                goto LAB_00133ff6;
              }
              lVar15 = local_80 + 1;
            } while (lVar15 < missingshs->objects);
            local_b0 = (char *)0x0;
          }
LAB_00133ff6:
          paVar24 = local_88;
          if (missingshs->objects <= lVar15) {
            lVar15 = local_88->objects;
            bVar9 = true;
            goto LAB_00134174;
          }
          if (bVar9) break;
          uVar20 = esymtbl[(int)uVar20];
          pppdVar13 = pppdVar28;
          uVar10 = uVar20;
          local_98.ver = uVar20;
          if ((pppdVar28[8] != (tetrahedron)0x0) &&
             (pppdVar28[8][ver2edge[(int)uVar20]] != (double *)0x0)) {
            pppdVar5 = local_a0->sh;
            iVar3 = local_a0->shver;
            p1 = pppdVar5[sorgpivot[iVar3]];
            p2 = pppdVar5[sdestpivot[iVar3]];
            p3 = pppdVar5[sapexpivot[iVar3]];
            iedge = &local_98;
LAB_0013471c:
            report_selfint_face(this,(point)p1,(point)p2,(point)p3,local_a0,iedge,(int)local_b0,
                                types,poss);
          }
          do {
            ppdVar23 = pppdVar13[9];
            if ((ppdVar23 != (tetrahedron)0x0) &&
               (local_68.tet = pppdVar13, ppdVar23[uVar10 & 3] != (double *)0x0)) goto LAB_0013409f;
            local_68.tet = (tetrahedron *)((ulong)pppdVar13[uVar10 & 3] & 0xfffffffffffffff0);
            uVar10 = fsymtbl[(int)uVar10][(uint)pppdVar13[uVar10 & 3] & 0xf];
            pppdVar13 = local_68.tet;
          } while (pppdVar28 != local_68.tet);
          ppdVar23 = local_68.tet[9];
          local_68.ver = uVar10;
          if (ppdVar23 != (tetrahedron)0x0) {
LAB_0013409f:
            local_68.ver = uVar10;
            if (ppdVar23[uVar10 & 3] != (double *)0x0) {
              pppdVar5 = local_a0->sh;
              iVar3 = local_a0->shver;
              p1 = pppdVar5[sorgpivot[iVar3]];
              p2 = pppdVar5[sdestpivot[iVar3]];
              p3 = pppdVar5[sapexpivot[iVar3]];
              iedge = &local_68;
              goto LAB_0013471c;
            }
          }
          puVar1 = (uint *)((long)pppdVar28 + (long)this->elemmarkerindex * 4);
          *puVar1 = *puVar1 | 0x40 << (*(byte *)(ver2edge + (int)uVar20) & 0x1f);
          pcVar12 = arraypool::getblock(local_88,(int)local_88->objects);
          lVar15 = (long)paVar24->objectbytes *
                   ((long)paVar24->objectsperblock - 1U & paVar24->objects);
          paVar24->objects = paVar24->objects + 1;
          *(tetrahedron **)(pcVar12 + lVar15) = pppdVar28;
          *(uint *)(pcVar12 + lVar15 + 8) = uVar20;
          pppdVar13 = (tetrahedron *)*local_78;
        }
LAB_00133edd:
        pppdVar28 = (tetrahedron *)((ulong)pppdVar29[facepivot1[iVar3]] & 0xfffffffffffffff0);
        piVar19 = facepivot2[iVar3] + ((uint)pppdVar29[facepivot1[iVar3]] & 0xf);
        pppdVar29 = pppdVar28;
      } while (pppdVar13 != pppdVar28);
      lVar22 = lVar22 + 1;
      lVar15 = local_88->objects;
    } while ((lVar22 < lVar15) && (bVar9 == false));
LAB_00134174:
    if (0 < lVar15) {
      ppcVar6 = local_88->toparray;
      lVar22 = 0;
      do {
        lVar18 = (long)local_88->objectbytes *
                 (long)(int)(local_88->objectsperblockmark & (uint)lVar22);
        puVar1 = (uint *)(*(long *)(ppcVar6[(uint)lVar22 >>
                                            ((byte)local_88->log2objectsperblock & 0x1f)] + lVar18)
                         + (long)this->elemmarkerindex * 4);
        *puVar1 = *puVar1 & ~(0x40 << (*(byte *)(ver2edge +
                                                *(int *)(ppcVar6[(uint)lVar22 >>
                                                                 ((byte)local_88->
                                                                        log2objectsperblock & 0x1f)]
                                                        + lVar18 + 8)) & 0x1f));
        lVar22 = lVar22 + 1;
      } while (lVar15 != lVar22);
    }
    local_88->objects = 0;
    if (bVar9 != false) {
      lVar22 = local_70->objects;
      if (0 < lVar22) {
        ppcVar6 = local_70->toparray;
        lVar15 = 0;
        do {
          puVar1 = (uint *)(*(long *)(ppcVar6[(uint)lVar15 >>
                                              ((byte)local_70->log2objectsperblock & 0x1f)] +
                                     (long)local_70->objectbytes *
                                     (long)(int)(local_70->objectsperblockmark & (uint)lVar15)) +
                           (long)this->elemmarkerindex * 4);
          *puVar1 = *puVar1 & 0xfffffffe;
          lVar15 = lVar15 + 1;
        } while (lVar22 != lVar15);
      }
      lVar22 = botpoints->objects;
      if (0 < lVar22) {
        ppcVar6 = botpoints->toparray;
        lVar15 = 0;
        do {
          puVar1 = (uint *)(*(long *)(ppcVar6[(uint)lVar15 >>
                                              ((byte)botpoints->log2objectsperblock & 0x1f)] +
                                     (long)botpoints->objectbytes *
                                     (long)(int)(botpoints->objectsperblockmark & (uint)lVar15)) + 4
                           + (long)this->pointmarkindex * 4);
          *puVar1 = *puVar1 & 0xfffffffe;
          lVar15 = lVar15 + 1;
        } while (lVar22 != lVar15);
      }
      lVar22 = toppoints->objects;
      if (0 < lVar22) {
        ppcVar6 = toppoints->toparray;
        lVar15 = 0;
        do {
          puVar1 = (uint *)(*(long *)(ppcVar6[(uint)lVar15 >>
                                              ((byte)toppoints->log2objectsperblock & 0x1f)] +
                                     (long)toppoints->objectbytes *
                                     (long)(int)(toppoints->objectsperblockmark & (uint)lVar15)) + 4
                           + (long)this->pointmarkindex * 4);
          *puVar1 = *puVar1 & 0xfffffffe;
          lVar15 = lVar15 + 1;
        } while (lVar22 != lVar15);
      }
      local_70->objects = 0;
      botpoints->objects = 0;
      toppoints->objects = 0;
      uVar14 = randomnation(this,(int)missingshs->objects - 1);
      pcVar12 = missingshs->toparray
                [(int)(uint)uVar14 >> ((byte)missingshs->log2objectsperblock & 0x1f)];
      lVar22 = (long)missingshs->objectbytes *
               (long)(int)((uint)uVar14 & missingshs->objectsperblockmark);
      (this->recentsh).sh = *(shellface **)(pcVar12 + lVar22);
      (this->recentsh).shver = *(int *)(pcVar12 + lVar22 + 8);
      return (bool)(bVar9 ^ 1);
    }
  }
  paVar24 = local_70;
  if (2 < this->b->verbose) {
    printf("      Formed cavity: %ld (%ld) cross tets (edges).\n",local_70->objects,0);
  }
  if (0 < paVar24->objects) {
    lVar22 = 0;
    do {
      paVar8 = local_88;
      pcVar12 = paVar24->toparray[(uint)lVar22 >> ((byte)paVar24->log2objectsperblock & 0x1f)];
      lVar25 = (long)paVar24->objectbytes * (long)(int)(paVar24->objectsperblockmark & (uint)lVar22)
      ;
      lVar15 = *(long *)(pcVar12 + lVar25);
      lVar27 = (long)*(int *)(pcVar12 + lVar25 + 8);
      uVar4 = *(ulong *)(lVar15 + (ulong)(eorgoppotbl[lVar27] & 3) * 8);
      uVar26 = uVar4 & 0xfffffffffffffff0;
      lVar18 = (long)this->elemmarkerindex;
      if ((*(byte *)(uVar26 + lVar18 * 4) & 1) == 0) {
        iVar3 = fsymtbl[eorgoppotbl[lVar27]][(uint)uVar4 & 0xf];
        pcVar11 = arraypool::getblock(local_88,(int)local_88->objects);
        lVar15 = (long)paVar8->objectbytes * ((long)paVar8->objectsperblock - 1U & paVar8->objects);
        paVar8->objects = paVar8->objects + 1;
        *(ulong *)(pcVar11 + lVar15) = uVar26;
        *(int *)(pcVar11 + lVar15 + 8) = iVar3;
        lVar15 = *(long *)(pcVar12 + lVar25);
        lVar27 = (long)*(int *)(pcVar12 + lVar25 + 8);
        lVar18 = (long)this->elemmarkerindex;
      }
      uVar4 = *(ulong *)(lVar15 + (ulong)(edestoppotbl[lVar27] & 3) * 8);
      uVar26 = uVar4 & 0xfffffffffffffff0;
      iVar3 = fsymtbl[edestoppotbl[lVar27]][(uint)uVar4 & 0xf];
      if ((*(byte *)(uVar26 + lVar18 * 4) & 1) == 0) {
        pcVar12 = arraypool::getblock(botfaces,(int)botfaces->objects);
        lVar15 = (long)botfaces->objectbytes *
                 ((long)botfaces->objectsperblock - 1U & botfaces->objects);
        botfaces->objects = botfaces->objects + 1;
        *(ulong *)(pcVar12 + lVar15) = uVar26;
        *(int *)(pcVar12 + lVar15 + 8) = iVar3;
      }
      pdVar7 = *(point *)(uVar26 + (long)orgpivot[iVar3] * 8);
      lVar15 = (long)this->pointmarkindex;
      uVar20 = *(uint *)((long)pdVar7 + lVar15 * 4 + 4);
      pdVar17 = this->dummypoint;
      if (pdVar7 != pdVar17 && (uVar20 & 1) == 0) {
        *(uint *)((long)pdVar7 + lVar15 * 4 + 4) = uVar20 | 1;
        pcVar12 = arraypool::getblock(botpoints,(int)botpoints->objects);
        uVar4 = botpoints->objects;
        botpoints->objects = uVar4 + 1;
        *(point *)(pcVar12 +
                  (long)botpoints->objectbytes * ((long)botpoints->objectsperblock - 1U & uVar4)) =
             pdVar7;
        pcVar12 = arraypool::getblock(toppoints,(int)toppoints->objects);
        uVar4 = toppoints->objects;
        toppoints->objects = uVar4 + 1;
        *(point *)(pcVar12 +
                  (long)toppoints->objectbytes * ((long)toppoints->objectsperblock - 1U & uVar4)) =
             pdVar7;
        lVar15 = (long)this->pointmarkindex;
        pdVar17 = this->dummypoint;
      }
      pdVar7 = *(point *)(uVar26 + (long)destpivot[iVar3] * 8);
      uVar20 = *(uint *)((long)pdVar7 + lVar15 * 4 + 4);
      if (((uVar20 & 1) == 0) && (pdVar7 != pdVar17)) {
        *(uint *)((long)pdVar7 + lVar15 * 4 + 4) = uVar20 | 1;
        pcVar12 = arraypool::getblock(botpoints,(int)botpoints->objects);
        uVar4 = botpoints->objects;
        botpoints->objects = uVar4 + 1;
        *(point *)(pcVar12 +
                  (long)botpoints->objectbytes * ((long)botpoints->objectsperblock - 1U & uVar4)) =
             pdVar7;
        pcVar12 = arraypool::getblock(toppoints,(int)toppoints->objects);
        uVar4 = toppoints->objects;
        toppoints->objects = uVar4 + 1;
        *(point *)(pcVar12 +
                  (long)toppoints->objectbytes * ((long)toppoints->objectsperblock - 1U & uVar4)) =
             pdVar7;
      }
      lVar22 = lVar22 + 1;
      paVar24 = local_70;
    } while (lVar22 < local_70->objects);
  }
  lVar22 = toppoints->objects;
  if (0 < lVar22) {
    ppcVar6 = toppoints->toparray;
    lVar15 = 0;
    do {
      puVar1 = (uint *)(*(long *)(ppcVar6[(uint)lVar15 >>
                                          ((byte)toppoints->log2objectsperblock & 0x1f)] +
                                 (long)toppoints->objectbytes *
                                 (long)(int)(toppoints->objectsperblockmark & (uint)lVar15)) + 4 +
                       (long)this->pointmarkindex * 4);
      *puVar1 = *puVar1 & 0xfffffffe;
      lVar15 = lVar15 + 1;
    } while (lVar22 != lVar15);
  }
  lVar22 = botpoints->objects;
  if (0 < lVar22) {
    ppcVar6 = botpoints->toparray;
    lVar15 = 0;
    do {
      puVar1 = (uint *)(*(long *)(ppcVar6[(uint)lVar15 >>
                                          ((byte)botpoints->log2objectsperblock & 0x1f)] +
                                 (long)botpoints->objectbytes *
                                 (long)(int)(botpoints->objectsperblockmark & (uint)lVar15)) + 4 +
                       (long)this->pointmarkindex * 4);
      *puVar1 = *puVar1 & 0xfffffffe;
      lVar15 = lVar15 + 1;
    } while (lVar22 != lVar15);
  }
  this->cavitycount = this->cavitycount + 1;
  return true;
}

Assistant:

bool tetgenmesh::formcavity(triface* searchtet, arraypool* missingshs,
                            arraypool* crosstets, arraypool* topfaces, 
                            arraypool* botfaces, arraypool* toppoints, 
                            arraypool* botpoints)
{
  arraypool *crossedges;
  triface spintet, neightet, chkface, *parytet;
  face *parysh = NULL;
  point pa, pd, pe, *parypt;
  bool testflag, invalidflag;
  int intflag, types[2], poss[4];
  int t1ver;
  int i, j, k;

  // Temporarily re-use 'topfaces' for all crossing edges.
  crossedges = topfaces;

  if (b->verbose > 2) {
    printf("      Form the cavity of a missing region.\n"); 
  }
  // Mark this edge to avoid testing it later.
  markedge(*searchtet);
  crossedges->newindex((void **) &parytet);
  *parytet = *searchtet;

  invalidflag = 0; 
  // Collect all crossing tets.  Each cross tet is saved in the standard
  //   form [d,e,#,#], where [d,e] is a crossing edge, d lies below R.
  //   NEITHER d NOR e is a vertex of R (!pmarktested). 
  for (i = 0; i < crossedges->objects && !invalidflag; i++) {
    // Get a crossing edge [d,e,#,#].
    searchtet = (triface *) fastlookup(crossedges, i);
    // Sort vertices into the bottom and top arrays.
    pd = org(*searchtet);
    if (!pinfected(pd)) {
      pinfect(pd);
      botpoints->newindex((void **) &parypt);
      *parypt = pd;
    }
    pe = dest(*searchtet);
    if (!pinfected(pe)) {
      pinfect(pe);
      toppoints->newindex((void **) &parypt);
      *parypt = pe;
    }

    // All tets sharing this edge are crossing tets.
    spintet = *searchtet;
    while (1) {
      if (!infected(spintet)) {
        infect(spintet);
        crosstets->newindex((void **) &parytet);
        *parytet = spintet;
      }
      // Go to the next crossing tet.
      fnextself(spintet);
      if (spintet.tet == searchtet->tet) break;
    } // while (1)

    // Detect new crossing edges.
    spintet = *searchtet;
    while (1) {
      // spintet is [d,e,a,#], where d lies below R, and e lies above R. 
      pa = apex(spintet);
      if (pa != dummypoint) {
        if (!pmarktested(pa)) {
	      // There exists a crossing edge, either [e,a] or [a,d]. First check
          //   if the crossing edge has already be added, i.e.,to check if one
		  //   of the tetrahedron at this edge has been marked.
          testflag = true;
          for (j = 0; j < 2 && testflag; j++) {
            if (j == 0) {
              enext(spintet, neightet);
            } else {
              eprev(spintet, neightet);
            }
            while (1) {
              if (edgemarked(neightet)) {
                // This crossing edge has already been tested. Skip it.
                testflag = false;
                break;
              }
              fnextself(neightet);
              if (neightet.tet == spintet.tet) break;
            }
          } // j
          if (testflag) {
            // Test if [e,a] or [a,d] intersects R.
            // Do a brute-force search in the set of subfaces of R. Slow!
            //   Need to be improved!
            pd = org(spintet);
            pe = dest(spintet);
            for (k = 0; k < missingshs->objects; k++) {
              parysh = (face *) fastlookup(missingshs, k);
              intflag = tri_edge_test(sorg(*parysh), sdest(*parysh), 
                          sapex(*parysh), pe, pa, NULL, 1, types, poss);
              if (intflag > 0) {
                // Found intersection. 'a' lies below R.
				if (intflag == 2) {
                  enext(spintet, neightet);
				  if ((types[0] == (int) ACROSSFACE) || 
                      (types[0] == (int) ACROSSEDGE)) {
                    // Only this case is valid.
                  } else {
                    // A non-valid intersection. Maybe a PLC problem.
                    invalidflag = 1;
                  }
				} else {
				  // Coplanar intersection. Maybe a PLC problem.
				  invalidflag = 1;
				}
                break;
              }
              intflag = tri_edge_test(sorg(*parysh), sdest(*parysh), 
			              sapex(*parysh), pa, pd, NULL, 1, types, poss);
              if (intflag > 0) {
                // Found intersection. 'a' lies above R.
				if (intflag == 2) {
                  eprev(spintet, neightet);
				  if ((types[0] == (int) ACROSSFACE) || 
                      (types[0] == (int) ACROSSEDGE)) {
					// Only this case is valid.
                  } else {
				    // A non-valid intersection. Maybe a PLC problem.
                    invalidflag = 1;
                  }
				} else {
				  // Coplanar intersection. Maybe a PLC problem.
				  invalidflag = 1;
				}
                break;
              }
            } // k
            if (k < missingshs->objects) {
              // Found a pair of triangle - edge intersection.
              if (invalidflag) {
                break; // the while (1) loop
              }
              // Adjust the edge direction, so that its origin lies below R,
              //   and its destination lies above R.
              esymself(neightet);
              // This edge may be a segment.
              if (issubseg(neightet)) {
				report_selfint_face(sorg(*parysh), sdest(*parysh), 
                  sapex(*parysh),parysh,&neightet,intflag,types,poss);
              }
			  // Check if it is an edge of a subface.
			  chkface = neightet;
              while (1) {
                if (issubface(chkface)) break;
                fsymself(chkface);
                if (chkface.tet == neightet.tet) break;
              }
              if (issubface(chkface)) {
                // Two subfaces are intersecting.
                report_selfint_face(sorg(*parysh), sdest(*parysh), 
                  sapex(*parysh),parysh,&chkface,intflag,types,poss);
              }
			  
              // Mark this edge to avoid testing it again.
              markedge(neightet);
              crossedges->newindex((void **) &parytet);
              *parytet = neightet;            
            } else {
              // No intersection is found. It may be a PLC problem.
              invalidflag = 1;
              break; // the while (1) loop
            } // if (k == missingshs->objects)
          } // if (testflag)
	    } 
      } // if (pa != dummypoint)
      // Go to the next crossing tet.
      fnextself(spintet);
      if (spintet.tet == searchtet->tet) break;
    } // while (1)
  } // i

  // Unmark all marked edges.
  for (i = 0; i < crossedges->objects; i++) {
    searchtet = (triface *) fastlookup(crossedges, i);
    unmarkedge(*searchtet);
  }
  crossedges->restart();


  if (invalidflag) {
    // Unmark all collected tets.
    for (i = 0; i < crosstets->objects; i++) {
      searchtet = (triface *) fastlookup(crosstets, i);
      uninfect(*searchtet);
    }
    // Unmark all collected vertices.
    for (i = 0; i < botpoints->objects; i++) {
      parypt = (point *) fastlookup(botpoints, i);
      puninfect(*parypt);
    }
    for (i = 0; i < toppoints->objects; i++) {
      parypt = (point *) fastlookup(toppoints, i);
      puninfect(*parypt);
    }
    crosstets->restart();
    botpoints->restart();
    toppoints->restart();

    // Randomly split an interior edge of R.
    i = randomnation(missingshs->objects - 1);
    recentsh = * (face *) fastlookup(missingshs, i);
    return false;
  }

  if (b->verbose > 2) {
    printf("      Formed cavity: %ld (%ld) cross tets (edges).\n", 
           crosstets->objects, crossedges->objects);
  }

  // Collect the top and bottom faces and the middle vertices. Since all top
  //   and bottom vertices have been infected. Uninfected vertices must be
  //   middle vertices (i.e., the vertices of R).
  // NOTE 1: Hull tets may be collected. Process them as a normal one.
  // NOTE 2: Some previously recovered subfaces may be completely inside the
  //   cavity. In such case, we remove these subfaces from the cavity and put
  //   them into 'subfacstack'. They will be recovered later.
  // NOTE 3: Some segments may be completely inside the cavity, e.g., they
  //   attached to a subface which is inside the cavity. Such segments are
  //   put in 'subsegstack'. They will be recovered later. 
  // NOTE4 : The interior subfaces and segments mentioned in NOTE 2 and 3
  //   are identified in the routine "carvecavity()". 

  for (i = 0; i < crosstets->objects; i++) {
    searchtet = (triface *) fastlookup(crosstets, i);
    // searchtet is [d,e,a,b].
    eorgoppo(*searchtet, spintet);
    fsym(spintet, neightet); // neightet is [a,b,e,#]
    if (!infected(neightet)) {
      // A top face.
      topfaces->newindex((void **) &parytet);
      *parytet = neightet;
    }
    edestoppo(*searchtet, spintet);
    fsym(spintet, neightet); // neightet is [b,a,d,#]
    if (!infected(neightet)) {
      // A bottom face.
      botfaces->newindex((void **) &parytet);
      *parytet = neightet;
    }
    // Add middle vertices if there are (skip dummypoint).
    pa = org(neightet);
    if (!pinfected(pa)) {
      if (pa != dummypoint) {
        pinfect(pa);
        botpoints->newindex((void **) &parypt);
        *parypt = pa;
        toppoints->newindex((void **) &parypt);
        *parypt = pa;
      }
    }
    pa = dest(neightet);
    if (!pinfected(pa)) {
      if (pa != dummypoint) {
        pinfect(pa);
        botpoints->newindex((void **) &parypt);
        *parypt = pa;
        toppoints->newindex((void **) &parypt);
        *parypt = pa;
      }
    }
  } // i

  // Uninfect all collected top, bottom, and middle vertices.
  for (i = 0; i < toppoints->objects; i++) {
    parypt = (point *) fastlookup(toppoints, i);
    puninfect(*parypt);
  }
  for (i = 0; i < botpoints->objects; i++) {
    parypt = (point *) fastlookup(botpoints, i);
    puninfect(*parypt);
  }
  cavitycount++;

  return true;
}